

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O3

void req0_ctx_send(void *arg,nni_aio *aio)

{
  uint32_t *idp;
  nni_mtx *mtx;
  req0_sock *s;
  _Bool _Var1;
  nng_err result;
  int iVar2;
  nni_msg *m;
  size_t sVar3;
  nni_time nVar4;
  
  s = *arg;
  m = nni_aio_get_msg(aio);
  mtx = &s->mtx;
  nni_mtx_lock(mtx);
  if (s->closed == true) {
    nni_mtx_unlock(mtx);
    result = NNG_ECLOSED;
LAB_0011ab01:
    nni_aio_finish_error(aio,result);
    return;
  }
  if (*(nni_aio **)((long)arg + 0x50) != (nni_aio *)0x0) {
    nni_aio_finish_error(*(nni_aio **)((long)arg + 0x50),NNG_ECANCELED);
    *(undefined8 *)((long)arg + 0x50) = 0;
  }
  if (*(nni_aio **)((long)arg + 0x58) != (nni_aio *)0x0) {
    nni_aio_set_msg(*(nni_aio **)((long)arg + 0x58),*(nni_msg **)((long)arg + 0x60));
    nni_msg_header_clear(*(nni_msg **)((long)arg + 0x60));
    *(undefined8 *)((long)arg + 0x60) = 0;
    nni_aio_finish_error(*(nni_aio **)((long)arg + 0x58),NNG_ECANCELED);
    *(undefined8 *)((long)arg + 0x58) = 0;
    nni_list_remove(&s->send_queue,arg);
  }
  req0_ctx_reset((req0_ctx *)arg);
  idp = (uint32_t *)((long)arg + 0x48);
  result = nni_id_alloc32(&s->requests,idp,arg);
  if (result != NNG_OK) {
    nni_mtx_unlock(mtx);
    goto LAB_0011ab01;
  }
  nni_msg_header_clear(m);
  nni_msg_header_append_u32(m,*idp);
  iVar2 = nni_list_empty(&s->ready_pipes);
  if (iVar2 != 0) {
    _Var1 = nni_aio_start(aio,req0_ctx_cancel_send,arg);
    if (!_Var1) {
      nni_id_remove(&s->requests,(ulong)*idp);
      goto LAB_0011abf9;
    }
  }
  sVar3 = nni_msg_len(m);
  *(size_t *)((long)arg + 0x68) = sVar3;
  *(nni_msg **)((long)arg + 0x60) = m;
  *(nni_aio **)((long)arg + 0x58) = aio;
  nni_aio_set_msg(aio,(nni_msg *)0x0);
  if (0 < *(int *)((long)arg + 0x78)) {
    nVar4 = nni_clock();
    *(nni_time *)((long)arg + 0x80) = (long)*(int *)((long)arg + 0x78) + nVar4;
    nni_list_append(&s->retry_queue,arg);
    if (s->retry_active == false) {
      s->retry_active = true;
      nni_sleep_aio(s->retry_tick,&s->retry_aio);
    }
  }
  nni_list_append(&s->send_queue,arg);
  req0_run_send_queue(s,(nni_aio_completions *)0x0);
LAB_0011abf9:
  nni_mtx_unlock(mtx);
  return;
}

Assistant:

static void
req0_ctx_send(void *arg, nni_aio *aio)
{
	req0_ctx  *ctx = arg;
	req0_sock *s   = ctx->sock;
	nng_msg   *msg = nni_aio_get_msg(aio);
	int        rv;

	nni_mtx_lock(&s->mtx);
	if (s->closed) {
		nni_mtx_unlock(&s->mtx);
		nni_aio_finish_error(aio, NNG_ECLOSED);
		return;
	}
	// Sending a new request cancels the old one, including any
	// outstanding reply.
	if (ctx->recv_aio != NULL) {
		nni_aio_finish_error(ctx->recv_aio, NNG_ECANCELED);
		ctx->recv_aio = NULL;
	}
	if (ctx->send_aio != NULL) {
		nni_aio_set_msg(ctx->send_aio, ctx->req_msg);
		nni_msg_header_clear(ctx->req_msg);
		ctx->req_msg = NULL;
		nni_aio_finish_error(ctx->send_aio, NNG_ECANCELED);
		ctx->send_aio = NULL;
		nni_list_remove(&s->send_queue, ctx);
	}

	// This resets the entire state machine.
	req0_ctx_reset(ctx);

	// Insert us on the per ID hash list, so that receives can find us.
	if ((rv = nni_id_alloc32(&s->requests, &ctx->request_id, ctx)) != 0) {
		nni_mtx_unlock(&s->mtx);
		nni_aio_finish_error(aio, rv);
		return;
	}
	nni_msg_header_clear(msg);
	nni_msg_header_append_u32(msg, ctx->request_id);

	// only do asynch if we're going to defer -- this is somewhat subtle
	// because we can have been submitted for a non-blocking operation and
	// in that case we would not like to timeout the operation instantly.
	if (nni_list_empty(&s->ready_pipes) &&
	    !nni_aio_start(aio, req0_ctx_cancel_send, ctx)) {
		nni_id_remove(&s->requests, ctx->request_id);
		nni_mtx_unlock(&s->mtx);
		return;
	}
	ctx->req_len  = nni_msg_len(msg);
	ctx->req_msg  = msg;
	ctx->send_aio = aio;
	nni_aio_set_msg(aio, NULL);

	if (ctx->retry > 0) {
		ctx->retry_time = nni_clock() + ctx->retry;
		nni_list_append(&s->retry_queue, ctx);
		if (!s->retry_active) {
			s->retry_active = true;
			nni_sleep_aio(s->retry_tick, &s->retry_aio);
		}
	}

	// Stick us on the send_queue list.
	nni_list_append(&s->send_queue, ctx);

	req0_run_send_queue(s, NULL);
	nni_mtx_unlock(&s->mtx);
}